

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_suite.cpp
# Opt level: O2

void enum_class_suite::to_enum(void)

{
  enumeration eVar1;
  variable input;
  
  input.storage.current = '\x06';
  input.storage.storage._0_4_ = 0x2a;
  eVar1 = trial::dynamic::convert::
          into<enum_class_suite::enumeration,trial::dynamic::basic_variable<std::allocator<char>>>
                    (&input);
  boost::detail::test_impl
            ("result == enumeration::alpha",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/enum_suite.cpp"
             ,0x5d,"void enum_class_suite::to_enum()",eVar1 == alpha);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
  ::~small_union(&input.storage);
  return;
}

Assistant:

void to_enum()
{
    variable input = static_cast<underlying_type>(enumeration::alpha);
    auto result = convert::into<enumeration>(input);
    TRIAL_PROTOCOL_TEST(result == enumeration::alpha);
}